

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O0

bool __thiscall RecordType::ByteOrderSensitive(RecordType *this)

{
  bool bVar1;
  uint uVar2;
  reference ppRVar3;
  __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
  *in_RDI;
  RecordField *f;
  iterator i;
  vector<RecordField_*,_std::allocator<RecordField_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
  local_18 [3];
  
  if (in_RDI[0x33]._M_current != (RecordField **)0x0) {
    local_18[0]._M_current =
         (RecordField **)
         std::vector<RecordField_*,_std::allocator<RecordField_*>_>::begin
                   (in_stack_ffffffffffffffc8);
    while( true ) {
      std::vector<RecordField_*,_std::allocator<RecordField_*>_>::end(in_stack_ffffffffffffffc8);
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                                 *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      ppRVar3 = __gnu_cxx::
                __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                ::operator*(local_18);
      uVar2 = (*((*ppRVar3)->super_Field).super_DataDepElement._vptr_DataDepElement[0xf])();
      if ((uVar2 & 1) != 0) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
      ::operator++(local_18);
    }
  }
  return false;
}

Assistant:

bool RecordType::ByteOrderSensitive() const
	{
	foreach (i, RecordFieldList, record_fields_)
		{
		RecordField* f = *i;
		if ( f->RequiresByteOrder() )
			return true;
		}
	return false;
	}